

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void duckdb::BitpackingCompressionState<unsigned_short,_true,_short>::BitpackingWriter::
     WriteDeltaFor(unsigned_short *values,bool *validity,bitpacking_width_t width,
                  unsigned_short frame_of_reference,short delta_offset,
                  unsigned_short *original_values,idx_t count,void *data_ptr)

{
  BitpackingCompressionState<unsigned_short,_true,_short> *state_00;
  unsigned_short in_CX;
  byte in_DL;
  short in_R8W;
  BitpackingCompressionState<unsigned_short,_true,_short> *in_R9;
  idx_t bp_size;
  BitpackingCompressionState<unsigned_short,_true,_short> *state;
  undefined2 in_stack_00000020;
  undefined1 in_stack_00000026;
  undefined7 in_stack_ffffffffffffffc8;
  bitpacking_width_t in_stack_ffffffffffffffcf;
  idx_t in_stack_ffffffffffffffd0;
  
  state_00 = (BitpackingCompressionState<unsigned_short,_true,_short> *)
             BitpackingPrimitives::GetRequiredSize
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
  ReserveSpace(state_00,CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  WriteMetaData(in_R9,(BitpackingMode)((ulong)state >> 0x38));
  WriteData<unsigned_short>(&state->data_ptr,in_CX);
  WriteData<unsigned_short>(&state->data_ptr,(ushort)in_DL);
  WriteData<short>(&state->data_ptr,in_R8W);
  BitpackingPrimitives::PackBuffer<unsigned_short,false>
            ((data_ptr_t)values,(unsigned_short *)validity,
             CONCAT17(width,CONCAT16(in_stack_00000026,
                                     CONCAT24(frame_of_reference,
                                              CONCAT22(delta_offset,in_stack_00000020)))),
             original_values._7_1_);
  state->data_ptr = state->data_ptr + (long)(&state_00->state + -1) + 0x27f0;
  UpdateStats(state_00,CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

static void WriteDeltaFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference,
		                          T_S delta_offset, T *original_values, idx_t count, void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 3 * sizeof(T));

			WriteMetaData(state, BitpackingMode::DELTA_FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, static_cast<T>(width));
			WriteData(state->data_ptr, delta_offset);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}